

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::Int64Value::ByteSizeLong(Int64Value *this)

{
  uint32_t *puVar1;
  int64_t iVar2;
  size_t sVar3;
  size_t sStack_20;
  uint32_t cached_has_bits;
  size_t total_size;
  Int64Value *this_;
  Int64Value *this_local;
  
  sStack_20 = 0;
  puVar1 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if (((*puVar1 & 1) != 0) && (iVar2 = _internal_value(this), iVar2 != 0)) {
    iVar2 = _internal_value(this);
    sStack_20 = internal::WireFormatLite::Int64SizePlusOne(iVar2);
  }
  sVar3 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_20,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t Int64Value::ByteSizeLong() const {
  const Int64Value& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.Int64Value)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // int64 value = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (this_._internal_value() != 0) {
        total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
            this_._internal_value());
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}